

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O0

void __thiscall QMdiAreaPrivate::showRubberBandFor(QMdiAreaPrivate *this,QMdiSubWindow *subWindow)

{
  long lVar1;
  QRect *pQVar2;
  int __sig;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect *in_stack_ffffffffffffffb8;
  QWidgetData *geom;
  QRubberBand *in_stack_ffffffffffffffc0;
  QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> *this_00;
  undefined1 local_20 [4];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != (QWidget *)0x0) && (in_RDI[0x13].data != (QWidgetData *)0x0)) {
    if (*(int *)&in_RDI[0x17].data == 1) {
      this_00 = *(QListSpecialMethodsBase<QPointer<QMdiSubWindow>_> **)(in_RDI + 0x14);
      QListSpecialMethodsBase<QPointer<QMdiSubWindow>>::indexOf<QMdiSubWindow*>
                (this_00,(QMdiSubWindow **)in_stack_ffffffffffffffb8,0x612686);
      _local_20 = QTabBar::tabRect(local_20._8_8_,local_20._4_4_);
      __sig = (int)local_20;
      QRubberBand::setGeometry((QRubberBand *)this_00,in_stack_ffffffffffffffb8);
    }
    else {
      geom = in_RDI[0x13].data;
      pQVar2 = QWidget::geometry(in_RSI);
      __sig = (int)pQVar2;
      QRubberBand::setGeometry(in_stack_ffffffffffffffc0,(QRect *)geom);
    }
    QWidget::raise((QWidget *)in_RDI[0x13].data,__sig);
    QWidget::show(in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiAreaPrivate::showRubberBandFor(QMdiSubWindow *subWindow)
{
    if (!subWindow || !rubberBand)
        return;

#if QT_CONFIG(tabbar)
    if (viewMode == QMdiArea::TabbedView)
        rubberBand->setGeometry(tabBar->tabRect(childWindows.indexOf(subWindow)));
    else
#endif
        rubberBand->setGeometry(subWindow->geometry());

    rubberBand->raise();
    rubberBand->show();
}